

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__hdr_test(stbi__context *s)

{
  stbi_uc *psVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  char cVar5;
  long lVar6;
  
  psVar1 = s->buffer_start;
  cVar5 = '#';
  lVar6 = 1;
  do {
    pbVar4 = s->img_buffer;
    if (pbVar4 < s->img_buffer_end) {
LAB_00108c66:
      s->img_buffer = pbVar4 + 1;
      uVar3 = (uint)*pbVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar2 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar2;
        }
        pbVar4 = s->img_buffer;
        goto LAB_00108c66;
      }
      uVar3 = 0;
    }
    if (uVar3 != (int)cVar5) {
      iVar2 = 0;
      goto LAB_00108c96;
    }
    cVar5 = "#?RADIANCE\n"[lVar6];
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xc) {
      iVar2 = 1;
LAB_00108c96:
      s->img_buffer = s->img_buffer_original;
      return iVar2;
    }
  } while( true );
}

Assistant:

static int stbi__hdr_test(stbi__context* s)
{
   int r = stbi__hdr_test_core(s);
   stbi__rewind(s);
   return r;
}